

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O3

RotationY<double> * __thiscall
qclab::qgates::RotationY<double>::operator/=(RotationY<double> *this,RotationY<double> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (*(this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])();
  iVar6 = (*(rhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])(rhs);
  if (iVar5 == iVar6) {
    dVar2 = (rhs->super_QRotationGate1<double>).rotation_.angle_.cos_;
    dVar3 = (this->super_QRotationGate1<double>).rotation_.angle_.cos_;
    dVar4 = (this->super_QRotationGate1<double>).rotation_.angle_.sin_;
    dVar1 = (rhs->super_QRotationGate1<double>).rotation_.angle_.sin_;
    (this->super_QRotationGate1<double>).rotation_.angle_.cos_ = dVar2 * dVar3 + dVar4 * dVar1;
    (this->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar2 * dVar4 + -dVar3 * dVar1;
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xa9,
                "RotationY<T> &qclab::qgates::RotationY<double>::operator/=(const RotationY<T> &) [T = double]"
               );
}

Assistant:

inline RotationY< T >& operator/=( const RotationY< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ /= rhs.rotation() ;
          return *this ;
        }